

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.cc
# Opt level: O0

void __thiscall draco::DirectBitDecoder::~DirectBitDecoder(DirectBitDecoder *this)

{
  DirectBitDecoder *unaff_retaddr;
  
  Clear(unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&unaff_retaddr->bits_);
  return;
}

Assistant:

DirectBitDecoder::~DirectBitDecoder() { Clear(); }